

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3AlterFinishAddColumn(Parse *pParse,Token *pColDef)

{
  sqlite3 *db;
  Table *pTVar1;
  Vdbe *p;
  char *pcVar2;
  Column *pCVar3;
  Expr *pEVar4;
  char *__src;
  byte bVar5;
  int iVar6;
  Table *pTab;
  byte *__dest;
  uint uVar7;
  Schema **ppSVar8;
  Expr *pExpr;
  char *pcVar9;
  byte *pbVar10;
  Parse *pCtx;
  long lVar11;
  int p1;
  ulong uVar12;
  sqlite3_value *pVal;
  
  if ((pParse->nErr == 0) && (db = pParse->db, db->mallocFailed == '\0')) {
    pTVar1 = pParse->pNewTable;
    if (pTVar1->pSchema == (Schema *)0x0) {
      uVar12 = 0xfff0bdc0;
    }
    else {
      uVar7 = db->nDb;
      if ((int)uVar7 < 1) {
        uVar12 = 0;
      }
      else {
        ppSVar8 = &db->aDb->pSchema;
        uVar12 = 0;
        do {
          if (*ppSVar8 == pTVar1->pSchema) goto LAB_002322ef;
          uVar12 = uVar12 + 1;
          ppSVar8 = ppSVar8 + 4;
        } while (uVar7 != uVar12);
        uVar12 = (ulong)uVar7;
      }
    }
LAB_002322ef:
    p = pParse->pVdbe;
    p1 = (int)uVar12;
    pcVar9 = db->aDb[p1].zDbSName;
    pcVar2 = pTVar1->zName;
    pCVar3 = pTVar1->aCol;
    lVar11 = (long)pTVar1->nCol;
    pEVar4 = pCVar3[lVar11 + -1].pDflt;
    pCtx = pParse;
    pTab = sqlite3FindTable(db,pcVar2 + 0x10,pcVar9);
    iVar6 = sqlite3AuthCheck(pParse,0x1a,pcVar9,pTab->zName,(char *)0x0);
    if (iVar6 == 0) {
      if (pEVar4 == (Expr *)0x0) {
        pExpr = (Expr *)0x0;
      }
      else {
        pExpr = (Expr *)0x0;
        if (pEVar4->pLeft->op != 'e') {
          pExpr = pEVar4;
        }
      }
      if ((pCVar3[lVar11 + -1].colFlags & 1) == 0) {
        if (pTVar1->pIndex == (Index *)0x0) {
          if ((((db->flags & 0x4000) == 0) || (pTVar1->pFKey == (FKey *)0x0)) ||
             (pExpr == (Expr *)0x0)) {
            if ((pCVar3[lVar11 + -1].notNull == '\0') || (pExpr != (Expr *)0x0)) {
              if (pExpr != (Expr *)0x0) {
                pVal = (sqlite3_value *)0x0;
                iVar6 = valueFromExpr(db,pExpr,'\x01','A',&pVal,(ValueNewStat4Ctx *)pCtx);
                if (iVar6 != 0) {
                  return;
                }
                if (pVal == (sqlite3_value *)0x0) {
                  sqlite3ErrorMsg(pParse,"Cannot add a column with non-constant default");
                  return;
                }
                sqlite3ValueFree(pVal);
              }
              __src = pColDef->z;
              if (__src == (char *)0x0) {
                __dest = (byte *)0x0;
              }
              else {
                uVar12 = (ulong)pColDef->n;
                __dest = (byte *)sqlite3DbMallocRawNN(db,uVar12 + 1);
                if (__dest != (byte *)0x0) {
                  memcpy(__dest,__src,uVar12);
                  __dest[uVar12] = 0;
                }
              }
              if (__dest != (byte *)0x0) {
                iVar6 = db->flags;
                uVar7 = pColDef->n - 1;
                if (uVar7 != 0) {
                  pbVar10 = __dest + uVar7;
                  do {
                    if (((ulong)*pbVar10 != 0x3b) && ((""[*pbVar10] & 1) == 0)) break;
                    *pbVar10 = 0;
                    pbVar10 = pbVar10 + -1;
                  } while (__dest < pbVar10);
                }
                pbVar10 = (byte *)((long)&db->flags + 3);
                *pbVar10 = *pbVar10 | 2;
                sqlite3NestedParse(pParse,
                                   "UPDATE \"%w\".%s SET sql = substr(sql,1,%d) || \', \' || %Q || substr(sql,%d) WHERE type = \'table\' AND name = %Q"
                                   ,pcVar9,"sqlite_master",(ulong)(uint)pTVar1->addColOffset,__dest,
                                   (ulong)(pTVar1->addColOffset + 1),pcVar2 + 0x10);
                sqlite3DbFreeNN(db,__dest);
                db->flags = iVar6;
              }
              if (pParse->nTempReg == '\0') {
                iVar6 = pParse->nMem + 1;
                pParse->nMem = iVar6;
              }
              else {
                bVar5 = pParse->nTempReg - 1;
                pParse->nTempReg = bVar5;
                iVar6 = pParse->aTempReg[bVar5];
              }
              sqlite3VdbeAddOp3(p,0x65,p1,iVar6,2);
              sqlite3VdbeUsesBtree(p,p1);
              sqlite3VdbeAddOp3(p,0x45,iVar6,-2,0);
              sqlite3VdbeAddOp3(p,0x2e,iVar6,p->nOp + 2,0);
              sqlite3VdbeAddOp3(p,0x66,p1,2,3);
              sqlite3ReleaseTempReg(pParse,iVar6);
              reloadTableSchema(pParse,pTab,pTab->zName);
              return;
            }
            pcVar9 = "Cannot add a NOT NULL column with default value NULL";
          }
          else {
            pcVar9 = "Cannot add a REFERENCES column with non-NULL default value";
          }
        }
        else {
          pcVar9 = "Cannot add a UNIQUE column";
        }
      }
      else {
        pcVar9 = "Cannot add a PRIMARY KEY column";
      }
      sqlite3ErrorMsg(pParse,pcVar9);
      return;
    }
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3AlterFinishAddColumn(Parse *pParse, Token *pColDef){
  Table *pNew;              /* Copy of pParse->pNewTable */
  Table *pTab;              /* Table being altered */
  int iDb;                  /* Database number */
  const char *zDb;          /* Database name */
  const char *zTab;         /* Table name */
  char *zCol;               /* Null-terminated column definition */
  Column *pCol;             /* The new column */
  Expr *pDflt;              /* Default value for the new column */
  sqlite3 *db;              /* The database connection; */
  Vdbe *v = pParse->pVdbe;  /* The prepared statement under construction */
  int r1;                   /* Temporary registers */

  db = pParse->db;
  if( pParse->nErr || db->mallocFailed ) return;
  assert( v!=0 );
  pNew = pParse->pNewTable;
  assert( pNew );

  assert( sqlite3BtreeHoldsAllMutexes(db) );
  iDb = sqlite3SchemaToIndex(db, pNew->pSchema);
  zDb = db->aDb[iDb].zDbSName;
  zTab = &pNew->zName[16];  /* Skip the "sqlite_altertab_" prefix on the name */
  pCol = &pNew->aCol[pNew->nCol-1];
  pDflt = pCol->pDflt;
  pTab = sqlite3FindTable(db, zTab, zDb);
  assert( pTab );

#ifndef SQLITE_OMIT_AUTHORIZATION
  /* Invoke the authorization callback. */
  if( sqlite3AuthCheck(pParse, SQLITE_ALTER_TABLE, zDb, pTab->zName, 0) ){
    return;
  }
#endif

  /* If the default value for the new column was specified with a 
  ** literal NULL, then set pDflt to 0. This simplifies checking
  ** for an SQL NULL default below.
  */
  assert( pDflt==0 || pDflt->op==TK_SPAN );
  if( pDflt && pDflt->pLeft->op==TK_NULL ){
    pDflt = 0;
  }

  /* Check that the new column is not specified as PRIMARY KEY or UNIQUE.
  ** If there is a NOT NULL constraint, then the default value for the
  ** column must not be NULL.
  */
  if( pCol->colFlags & COLFLAG_PRIMKEY ){
    sqlite3ErrorMsg(pParse, "Cannot add a PRIMARY KEY column");
    return;
  }
  if( pNew->pIndex ){
    sqlite3ErrorMsg(pParse, "Cannot add a UNIQUE column");
    return;
  }
  if( (db->flags&SQLITE_ForeignKeys) && pNew->pFKey && pDflt ){
    sqlite3ErrorMsg(pParse, 
        "Cannot add a REFERENCES column with non-NULL default value");
    return;
  }
  if( pCol->notNull && !pDflt ){
    sqlite3ErrorMsg(pParse, 
        "Cannot add a NOT NULL column with default value NULL");
    return;
  }

  /* Ensure the default expression is something that sqlite3ValueFromExpr()
  ** can handle (i.e. not CURRENT_TIME etc.)
  */
  if( pDflt ){
    sqlite3_value *pVal = 0;
    int rc;
    rc = sqlite3ValueFromExpr(db, pDflt, SQLITE_UTF8, SQLITE_AFF_BLOB, &pVal);
    assert( rc==SQLITE_OK || rc==SQLITE_NOMEM );
    if( rc!=SQLITE_OK ){
      assert( db->mallocFailed == 1 );
      return;
    }
    if( !pVal ){
      sqlite3ErrorMsg(pParse, "Cannot add a column with non-constant default");
      return;
    }
    sqlite3ValueFree(pVal);
  }

  /* Modify the CREATE TABLE statement. */
  zCol = sqlite3DbStrNDup(db, (char*)pColDef->z, pColDef->n);
  if( zCol ){
    char *zEnd = &zCol[pColDef->n-1];
    int savedDbFlags = db->flags;
    while( zEnd>zCol && (*zEnd==';' || sqlite3Isspace(*zEnd)) ){
      *zEnd-- = '\0';
    }
    db->flags |= SQLITE_PreferBuiltin;
    sqlite3NestedParse(pParse, 
        "UPDATE \"%w\".%s SET "
          "sql = substr(sql,1,%d) || ', ' || %Q || substr(sql,%d) "
        "WHERE type = 'table' AND name = %Q", 
      zDb, MASTER_NAME, pNew->addColOffset, zCol, pNew->addColOffset+1,
      zTab
    );
    sqlite3DbFree(db, zCol);
    db->flags = savedDbFlags;
  }

  /* Make sure the schema version is at least 3.  But do not upgrade
  ** from less than 3 to 4, as that will corrupt any preexisting DESC
  ** index.
  */
  r1 = sqlite3GetTempReg(pParse);
  sqlite3VdbeAddOp3(v, OP_ReadCookie, iDb, r1, BTREE_FILE_FORMAT);
  sqlite3VdbeUsesBtree(v, iDb);
  sqlite3VdbeAddOp2(v, OP_AddImm, r1, -2);
  sqlite3VdbeAddOp2(v, OP_IfPos, r1, sqlite3VdbeCurrentAddr(v)+2);
  VdbeCoverage(v);
  sqlite3VdbeAddOp3(v, OP_SetCookie, iDb, BTREE_FILE_FORMAT, 3);
  sqlite3ReleaseTempReg(pParse, r1);

  /* Reload the schema of the modified table. */
  reloadTableSchema(pParse, pTab, pTab->zName);
}